

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.h
# Opt level: O2

FileInfo * __thiscall
llbuild::basic::ChecksumOnlyFileSystem::getFileInfo
          (FileInfo *__return_storage_ptr__,ChecksumOnlyFileSystem *this,string *path)

{
  FileSystem *pFVar1;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  (*((this->impl)._M_t.
     super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
     ._M_t.
     super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
     .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl)->_vptr_FileSystem[7])
            ();
  __return_storage_ptr__->device = 0;
  __return_storage_ptr__->inode = 0;
  (__return_storage_ptr__->modTime).seconds = 0;
  (__return_storage_ptr__->modTime).nanoseconds = 0;
  pFVar1 = (this->impl)._M_t.
           super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
           ._M_t.
           super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
           .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl;
  (*pFVar1->_vptr_FileSystem[6])(&local_38,pFVar1,path);
  *(undefined8 *)((__return_storage_ptr__->checksum).bytes + 0x10) = local_28;
  *(undefined8 *)((__return_storage_ptr__->checksum).bytes + 0x18) = uStack_20;
  *(undefined8 *)(__return_storage_ptr__->checksum).bytes = local_38;
  *(undefined8 *)((__return_storage_ptr__->checksum).bytes + 8) = uStack_30;
  return __return_storage_ptr__;
}

Assistant:

virtual FileInfo getFileInfo(const std::string& path) override {
    auto info = impl->getFileInfo(path);

    info.device = 0;
    info.inode = 0;
    info.modTime = FileTimestamp();
    info.modTime.seconds = 0;
    info.modTime.nanoseconds = 0;

    info.checksum = impl->getFileChecksum(path);

    return info;
  }